

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void rsg::(anonymous_namespace)::convertExecValueTempl<float,int>
               (ExecConstValueAccess src,ExecValueAccess dst)

{
  int iVar1;
  int ndx;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
    iVar1 = convert<float,int>(src.m_value[lVar2].floatVal);
    dst.super_ConstStridedValueAccess<64>.m_value[lVar2].intVal = iVar1;
  }
  return;
}

Assistant:

void convertExecValueTempl (ExecConstValueAccess src, ExecValueAccess dst)
{
	for (int ndx = 0; ndx < EXEC_VEC_WIDTH; ndx++)
		dst.as<DstType>(ndx) = convert<SrcType, DstType>(src.as<SrcType>(ndx));
}